

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMipsInstruction.cpp
# Opt level: O0

void __thiscall CMipsInstruction::encodeNormal(CMipsInstruction *this)

{
  MipsImmediateType MVar1;
  uint local_14;
  int32_t encoding;
  CMipsInstruction *this_local;
  
  local_14 = (this->opcodeData).opcode.destencoding;
  if ((this->registerData).grs.num != -1) {
    local_14 = ((this->registerData).grs.num & 0x1fU) << 0x15 | local_14;
  }
  if ((this->registerData).grt.num != -1) {
    local_14 = ((this->registerData).grt.num & 0x1fU) << 0x10 | local_14;
  }
  if ((this->registerData).grd.num != -1) {
    local_14 = ((this->registerData).grd.num & 0x1fU) << 0xb | local_14;
  }
  if ((this->registerData).frt.num != -1) {
    local_14 = ((this->registerData).frt.num & 0x1fU) << 0x10 | local_14;
  }
  if ((this->registerData).frs.num != -1) {
    local_14 = ((this->registerData).frs.num & 0x1fU) << 0xb | local_14;
  }
  if ((this->registerData).frd.num != -1) {
    local_14 = ((this->registerData).frd.num & 0x1fU) << 6 | local_14;
  }
  if ((this->registerData).ps2vrt.num != -1) {
    local_14 = (this->registerData).ps2vrt.num << 0x10 | local_14;
  }
  if ((this->registerData).ps2vrs.num != -1) {
    local_14 = (this->registerData).ps2vrs.num << 0x15 | local_14;
  }
  if ((this->registerData).ps2vrd.num != -1) {
    local_14 = (this->registerData).ps2vrd.num << 6 | local_14;
  }
  if ((this->registerData).rspvrt.num != -1) {
    local_14 = ((this->registerData).rspvrt.num & 0x1fU) << 0x10 | local_14;
  }
  if ((this->registerData).rspvrs.num != -1) {
    local_14 = ((this->registerData).rspvrs.num & 0x1fU) << 0xb | local_14;
  }
  if ((this->registerData).rspvrd.num != -1) {
    local_14 = ((this->registerData).rspvrd.num & 0x1fU) << 6 | local_14;
  }
  if ((this->registerData).rspve.num != -1) {
    local_14 = ((this->registerData).rspve.num & 0xfU) << 0x15 | local_14;
  }
  if ((this->registerData).rspvde.num != -1) {
    local_14 = ((this->registerData).rspvde.num & 0xfU) << 0xb | local_14;
  }
  if ((this->registerData).rspvealt.num != -1) {
    local_14 = ((this->registerData).rspvealt.num & 0xfU) << 7 | local_14;
  }
  if ((((this->opcodeData).opcode.flags & 0x20000U) == 0) && ((this->registerData).vrt.num != -1)) {
    local_14 = (this->registerData).vrt.num << 0x10 | local_14;
  }
  MVar1 = (this->immediateData).primary.type;
  if (MVar1 - Immediate5 < 2) {
LAB_0020fccf:
    local_14 = (this->immediateData).primary.value << 6 | local_14;
  }
  else {
    if (MVar1 != Immediate16) {
      if (MVar1 == Immediate20) goto LAB_0020fccf;
      if (4 < MVar1 - Immediate25) goto LAB_0020fcf2;
    }
    local_14 = (this->immediateData).primary.value | local_14;
  }
LAB_0020fcf2:
  MVar1 = (this->immediateData).secondary.type;
  if (MVar1 == CacheOp) {
    local_14 = (this->immediateData).secondary.value << 0x10 | local_14;
  }
  else if (MVar1 - Ext < 2) {
    local_14 = (this->immediateData).secondary.value << 0xb | local_14;
  }
  else if (MVar1 == Cop2BranchType) {
    local_14 = (this->immediateData).secondary.value << 0x12 | local_14;
  }
  if (((this->opcodeData).opcode.flags & 0x20000U) != 0) {
    local_14 = ((this->registerData).vrt.num & 0x1fU) << 0x10 |
               (this->registerData).vrt.num >> 5 | local_14;
  }
  FileManager::writeU32(g_fileManager,local_14);
  return;
}

Assistant:

void CMipsInstruction::encodeNormal() const
{
	int32_t encoding = opcodeData.opcode.destencoding;

	if (registerData.grs.num != -1) encoding |= MIPS_RS(registerData.grs.num);	// source reg
	if (registerData.grt.num != -1) encoding |= MIPS_RT(registerData.grt.num);	// target reg
	if (registerData.grd.num != -1) encoding |= MIPS_RD(registerData.grd.num);	// dest reg
	
	if (registerData.frt.num != -1) encoding |= MIPS_FT(registerData.frt.num);	// float target reg
	if (registerData.frs.num != -1) encoding |= MIPS_FS(registerData.frs.num);	// float source reg
	if (registerData.frd.num != -1) encoding |= MIPS_FD(registerData.frd.num);	// float dest reg

	if (registerData.ps2vrt.num != -1) encoding |= (registerData.ps2vrt.num << 16);	// ps2 vector target reg
	if (registerData.ps2vrs.num != -1) encoding |= (registerData.ps2vrs.num << 21);	// ps2 vector source reg
	if (registerData.ps2vrd.num != -1) encoding |= (registerData.ps2vrd.num << 6);	// ps2 vector dest reg

	if (registerData.rspvrt.num != -1) encoding |= MIPS_FT(registerData.rspvrt.num);	// rsp vector target reg
	if (registerData.rspvrs.num != -1) encoding |= MIPS_FS(registerData.rspvrs.num);	// rsp vector source reg
	if (registerData.rspvrd.num != -1) encoding |= MIPS_FD(registerData.rspvrd.num);	// rsp vector dest reg

	if (registerData.rspve.num != -1) encoding |= MIPS_RSP_VE(registerData.rspve.num);			// rsp element
	if (registerData.rspvde.num != -1) encoding |= MIPS_RSP_VDE(registerData.rspvde.num);		// rsp destination element
	if (registerData.rspvealt.num != -1) encoding |= MIPS_RSP_VEALT(registerData.rspvealt.num);	// rsp element (alt. placement)

	if (!(opcodeData.opcode.flags & MO_VFPU_MIXED) && registerData.vrt.num != -1)			// vfpu rt
		encoding |= registerData.vrt.num << 16;

	switch (immediateData.primary.type)
	{
	case MipsImmediateType::Immediate5:
	case MipsImmediateType::Immediate10:
	case MipsImmediateType::Immediate20:
		encoding |= immediateData.primary.value << 6;
		break;
	case MipsImmediateType::Immediate16:
	case MipsImmediateType::Immediate25:
	case MipsImmediateType::Immediate26:
	case MipsImmediateType::Immediate20_0:
	case MipsImmediateType::Immediate7:
	case MipsImmediateType::ImmediateHalfFloat:
		encoding |= immediateData.primary.value;
		break;
	default:
		// TODO: Assert?
		break;
	}

	switch (immediateData.secondary.type)
	{
	case MipsImmediateType::CacheOp:
		encoding |= immediateData.secondary.value << 16;
		break;
	case MipsImmediateType::Ext:
	case MipsImmediateType::Ins:
		encoding |= immediateData.secondary.value << 11;
		break;
	case MipsImmediateType::Cop2BranchType:
		encoding |= immediateData.secondary.value << 18;
		break;
	default:
		// TODO: Assert?
		break;
	}

	if (opcodeData.opcode.flags & MO_VFPU_MIXED)
	{
		// always vrt
		encoding |= registerData.vrt.num >> 5;
		encoding |= (registerData.vrt.num & 0x1F) << 16;
	}

	g_fileManager->writeU32((uint32_t)encoding);
}